

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multiuse_state(connectdata *conn,int bundlestate)

{
  int bundlestate_local;
  connectdata *conn_local;
  
  conn->bundle->multiuse = bundlestate;
  process_pending_handles(conn->data->multi);
  return;
}

Assistant:

void Curl_multiuse_state(struct connectdata *conn,
                         int bundlestate) /* use BUNDLE_* defines */
{
  DEBUGASSERT(conn);
  DEBUGASSERT(conn->bundle);
  DEBUGASSERT(conn->data);
  DEBUGASSERT(conn->data->multi);

  conn->bundle->multiuse = bundlestate;
  process_pending_handles(conn->data->multi);
}